

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O0

void __thiscall
AutoArgParse::UnexpectedArgException::UnexpectedArgException
          (UnexpectedArgException *this,string *unexpectedArg,FlagStore *flagStore)

{
  string local_40;
  FlagStore *local_20;
  FlagStore *flagStore_local;
  string *unexpectedArg_local;
  UnexpectedArgException *this_local;
  
  local_20 = flagStore;
  flagStore_local = (FlagStore *)unexpectedArg;
  unexpectedArg_local = (string *)this;
  makeErrorMessage(&local_40,unexpectedArg,flagStore);
  ParseException::ParseException(&this->super_ParseException,UNEXPECTED_ARG,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_ParseException = &PTR__UnexpectedArgException_00123a18;
  std::__cxx11::string::string((string *)&this->unexpectedArg,(string *)unexpectedArg);
  this->flagStore = local_20;
  return;
}

Assistant:

UnexpectedArgException(std::string unexpectedArg,
                           const FlagStore& flagStore)
        : ParseException(UNEXPECTED_ARG,
                         makeErrorMessage(unexpectedArg, flagStore)),
          unexpectedArg(std::move(unexpectedArg)),
          flagStore(flagStore) {}